

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ulong uVar8;
  Ref<embree::Geometry> *pRVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  float fVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  undefined4 uVar73;
  uint uVar74;
  uint uVar75;
  long lVar76;
  ulong uVar77;
  ulong uVar78;
  undefined1 (*pauVar79) [16];
  undefined1 (*pauVar80) [16];
  long lVar81;
  ulong unaff_R13;
  size_t mask;
  ulong uVar82;
  int iVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  float fVar89;
  float fVar94;
  float fVar95;
  vint4 bi;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar93 [32];
  uint uVar100;
  vint4 ai;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  uint uVar109;
  undefined1 auVar104 [16];
  uint uVar110;
  uint uVar111;
  uint uVar112;
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  uint uVar113;
  undefined1 auVar108 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  float fVar123;
  float fVar125;
  float fVar126;
  vint4 bi_1;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar124 [64];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong local_13e0;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float fStack_13b0;
  float fStack_13ac;
  float fStack_13a8;
  undefined4 uStack_13a4;
  undefined4 uStack_1384;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined1 local_1280 [32];
  undefined1 local_1260 [8];
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  undefined1 local_1240 [32];
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float local_1200;
  float fStack_11fc;
  float fStack_11f8;
  float fStack_11f4;
  float fStack_11f0;
  float fStack_11ec;
  float fStack_11e8;
  float fStack_11e4;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  undefined4 local_11c0;
  undefined4 uStack_11bc;
  undefined4 uStack_11b8;
  undefined4 uStack_11b4;
  undefined4 uStack_11b0;
  undefined4 uStack_11ac;
  undefined4 uStack_11a8;
  undefined4 uStack_11a4;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  undefined4 uStack_10c4;
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  undefined4 uStack_10a4;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  float local_1020 [4];
  float fStack_1010;
  float fStack_100c;
  float fStack_1008;
  undefined4 uStack_1004;
  float local_1000 [4];
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  undefined4 uStack_fe4;
  float local_fe0 [4];
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  undefined4 uStack_fc4;
  undefined1 local_fc0 [32];
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar80 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar73 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar121._4_4_ = uVar73;
  auVar121._0_4_ = uVar73;
  auVar121._8_4_ = uVar73;
  auVar121._12_4_ = uVar73;
  uVar73 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar131._4_4_ = uVar73;
  auVar131._0_4_ = uVar73;
  auVar131._8_4_ = uVar73;
  auVar131._12_4_ = uVar73;
  uVar73 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar134._4_4_ = uVar73;
  auVar134._0_4_ = uVar73;
  auVar134._8_4_ = uVar73;
  auVar134._12_4_ = uVar73;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar72 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar77 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar78 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar83 = (tray->tfar).field_0.i[k];
  auVar124 = ZEXT1664(CONCAT412(iVar83,CONCAT48(iVar83,CONCAT44(iVar83,iVar83))));
  iVar83 = (tray->tnear).field_0.i[k];
  auVar139._4_4_ = iVar83;
  auVar139._0_4_ = iVar83;
  auVar139._8_4_ = iVar83;
  auVar139._12_4_ = iVar83;
  local_1240._16_16_ = mm_lookupmask_ps._240_16_;
  local_1240._0_16_ = mm_lookupmask_ps._0_16_;
  auVar105._8_4_ = 0x3f800000;
  auVar105._0_8_ = &DAT_3f8000003f800000;
  auVar105._12_4_ = 0x3f800000;
  auVar105._16_4_ = 0x3f800000;
  auVar105._20_4_ = 0x3f800000;
  auVar105._24_4_ = 0x3f800000;
  auVar105._28_4_ = 0x3f800000;
  auVar85._8_4_ = 0xbf800000;
  auVar85._0_8_ = 0xbf800000bf800000;
  auVar85._12_4_ = 0xbf800000;
  auVar85._16_4_ = 0xbf800000;
  auVar85._20_4_ = 0xbf800000;
  auVar85._24_4_ = 0xbf800000;
  auVar85._28_4_ = 0xbf800000;
  _local_1260 = vblendvps_avx(auVar105,auVar85,local_1240);
  do {
    do {
      do {
        auVar138 = ZEXT1664(CONCAT412(fVar4,CONCAT48(fVar4,CONCAT44(fVar4,fVar4))));
        auVar137 = ZEXT1664(CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))));
        if (pauVar80 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar79 = pauVar80 + -1;
        pauVar80 = pauVar80 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar79 + 8));
      uVar71 = *(ulong *)*pauVar80;
      pauVar79 = pauVar80;
      do {
        if ((uVar71 & 8) == 0) {
          auVar84 = vsubps_avx(*(undefined1 (*) [16])(uVar71 + 0x20 + uVar72),auVar121);
          auVar104._0_4_ = fVar2 * auVar84._0_4_;
          auVar104._4_4_ = fVar2 * auVar84._4_4_;
          auVar104._8_4_ = fVar2 * auVar84._8_4_;
          auVar104._12_4_ = fVar2 * auVar84._12_4_;
          auVar84 = vsubps_avx(*(undefined1 (*) [16])(uVar71 + 0x20 + uVar77),auVar131);
          auVar92._0_4_ = fVar3 * auVar84._0_4_;
          auVar92._4_4_ = fVar3 * auVar84._4_4_;
          auVar92._8_4_ = fVar3 * auVar84._8_4_;
          auVar92._12_4_ = fVar3 * auVar84._12_4_;
          auVar84 = vpmaxsd_avx(auVar104,auVar92);
          auVar104 = vsubps_avx(*(undefined1 (*) [16])(uVar71 + 0x20 + uVar78),auVar134);
          auVar140._0_4_ = fVar4 * auVar104._0_4_;
          auVar140._4_4_ = fVar4 * auVar104._4_4_;
          auVar140._8_4_ = fVar4 * auVar104._8_4_;
          auVar140._12_4_ = fVar4 * auVar104._12_4_;
          auVar104 = vpmaxsd_avx(auVar140,auVar139);
          auVar104 = vpmaxsd_avx(auVar84,auVar104);
          auVar84 = vsubps_avx(*(undefined1 (*) [16])(uVar71 + 0x20 + (uVar72 ^ 0x10)),auVar121);
          auVar90._0_4_ = fVar2 * auVar84._0_4_;
          auVar90._4_4_ = fVar2 * auVar84._4_4_;
          auVar90._8_4_ = fVar2 * auVar84._8_4_;
          auVar90._12_4_ = fVar2 * auVar84._12_4_;
          auVar84 = vsubps_avx(*(undefined1 (*) [16])(uVar71 + 0x20 + (uVar77 ^ 0x10)),auVar131);
          auVar101._0_4_ = fVar3 * auVar84._0_4_;
          auVar101._4_4_ = fVar3 * auVar84._4_4_;
          auVar101._8_4_ = fVar3 * auVar84._8_4_;
          auVar101._12_4_ = fVar3 * auVar84._12_4_;
          auVar84 = vpminsd_avx(auVar90,auVar101);
          auVar92 = vsubps_avx(*(undefined1 (*) [16])(uVar71 + 0x20 + (uVar78 ^ 0x10)),auVar134);
          auVar102._0_4_ = fVar4 * auVar92._0_4_;
          auVar102._4_4_ = fVar4 * auVar92._4_4_;
          auVar102._8_4_ = fVar4 * auVar92._8_4_;
          auVar102._12_4_ = fVar4 * auVar92._12_4_;
          auVar92 = vpminsd_avx(auVar102,auVar124._0_16_);
          auVar84 = vpminsd_avx(auVar84,auVar92);
          auVar84 = vpcmpgtd_avx(auVar104,auVar84);
          uVar73 = vmovmskps_avx(auVar84);
          unaff_R13 = (ulong)(byte)((byte)uVar73 ^ 0xf);
          local_1180._0_16_ = auVar104;
        }
        pauVar80 = pauVar79;
        if ((uVar71 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar83 = 4;
          }
          else {
            uVar70 = uVar71 & 0xfffffffffffffff0;
            lVar81 = 0;
            if (unaff_R13 != 0) {
              for (; (unaff_R13 >> lVar81 & 1) == 0; lVar81 = lVar81 + 1) {
              }
            }
            iVar83 = 0;
            uVar71 = *(ulong *)(uVar70 + lVar81 * 8);
            uVar82 = unaff_R13 - 1 & unaff_R13;
            if (uVar82 != 0) {
              uVar100 = *(uint *)(local_1180 + lVar81 * 4);
              lVar81 = 0;
              if (uVar82 != 0) {
                for (; (uVar82 >> lVar81 & 1) == 0; lVar81 = lVar81 + 1) {
                }
              }
              uVar8 = *(ulong *)(uVar70 + lVar81 * 8);
              uVar74 = *(uint *)(local_1180 + lVar81 * 4);
              uVar82 = uVar82 - 1 & uVar82;
              if (uVar82 == 0) {
                pauVar80 = pauVar79 + 1;
                if (uVar100 < uVar74) {
                  *(ulong *)*pauVar79 = uVar8;
                  *(uint *)(*pauVar79 + 8) = uVar74;
                }
                else {
                  *(ulong *)*pauVar79 = uVar71;
                  *(uint *)(*pauVar79 + 8) = uVar100;
                  uVar71 = uVar8;
                }
              }
              else {
                auVar84._8_8_ = 0;
                auVar84._0_8_ = uVar71;
                auVar84 = vpunpcklqdq_avx(auVar84,ZEXT416(uVar100));
                auVar91._8_8_ = 0;
                auVar91._0_8_ = uVar8;
                auVar104 = vpunpcklqdq_avx(auVar91,ZEXT416(uVar74));
                lVar81 = 0;
                if (uVar82 != 0) {
                  for (; (uVar82 >> lVar81 & 1) == 0; lVar81 = lVar81 + 1) {
                  }
                }
                auVar103._8_8_ = 0;
                auVar103._0_8_ = *(ulong *)(uVar70 + lVar81 * 8);
                auVar140 = vpunpcklqdq_avx(auVar103,ZEXT416(*(uint *)(local_1180 + lVar81 * 4)));
                auVar92 = vpcmpgtd_avx(auVar104,auVar84);
                uVar82 = uVar82 - 1 & uVar82;
                if (uVar82 == 0) {
                  auVar90 = vpshufd_avx(auVar92,0xaa);
                  auVar92 = vblendvps_avx(auVar104,auVar84,auVar90);
                  auVar84 = vblendvps_avx(auVar84,auVar104,auVar90);
                  auVar104 = vpcmpgtd_avx(auVar140,auVar92);
                  auVar90 = vpshufd_avx(auVar104,0xaa);
                  auVar104 = vblendvps_avx(auVar140,auVar92,auVar90);
                  auVar92 = vblendvps_avx(auVar92,auVar140,auVar90);
                  auVar140 = vpcmpgtd_avx(auVar92,auVar84);
                  auVar90 = vpshufd_avx(auVar140,0xaa);
                  auVar140 = vblendvps_avx(auVar92,auVar84,auVar90);
                  auVar84 = vblendvps_avx(auVar84,auVar92,auVar90);
                  *pauVar79 = auVar84;
                  pauVar79[1] = auVar140;
                  uVar71 = auVar104._0_8_;
                  pauVar80 = pauVar79 + 2;
                }
                else {
                  lVar81 = 0;
                  if (uVar82 != 0) {
                    for (; (uVar82 >> lVar81 & 1) == 0; lVar81 = lVar81 + 1) {
                    }
                  }
                  auVar114._8_8_ = 0;
                  auVar114._0_8_ = *(ulong *)(uVar70 + lVar81 * 8);
                  auVar101 = vpunpcklqdq_avx(auVar114,ZEXT416(*(uint *)(local_1180 + lVar81 * 4)));
                  auVar90 = vpshufd_avx(auVar92,0xaa);
                  auVar92 = vblendvps_avx(auVar104,auVar84,auVar90);
                  auVar84 = vblendvps_avx(auVar84,auVar104,auVar90);
                  auVar104 = vpcmpgtd_avx(auVar101,auVar140);
                  auVar90 = vpshufd_avx(auVar104,0xaa);
                  auVar104 = vblendvps_avx(auVar101,auVar140,auVar90);
                  auVar140 = vblendvps_avx(auVar140,auVar101,auVar90);
                  auVar90 = vpcmpgtd_avx(auVar140,auVar84);
                  auVar101 = vpshufd_avx(auVar90,0xaa);
                  auVar90 = vblendvps_avx(auVar140,auVar84,auVar101);
                  auVar84 = vblendvps_avx(auVar84,auVar140,auVar101);
                  auVar140 = vpcmpgtd_avx(auVar104,auVar92);
                  auVar101 = vpshufd_avx(auVar140,0xaa);
                  auVar140 = vblendvps_avx(auVar104,auVar92,auVar101);
                  auVar104 = vblendvps_avx(auVar92,auVar104,auVar101);
                  auVar92 = vpcmpgtd_avx(auVar90,auVar104);
                  auVar101 = vpshufd_avx(auVar92,0xaa);
                  auVar92 = vblendvps_avx(auVar90,auVar104,auVar101);
                  auVar104 = vblendvps_avx(auVar104,auVar90,auVar101);
                  *pauVar79 = auVar84;
                  pauVar79[1] = auVar104;
                  pauVar79[2] = auVar92;
                  uVar71 = auVar140._0_8_;
                  pauVar80 = pauVar79 + 3;
                  iVar83 = 0;
                }
              }
            }
          }
        }
        else {
          iVar83 = 6;
        }
        pauVar79 = pauVar80;
      } while (iVar83 == 0);
    } while (iVar83 != 6);
    uVar70 = (ulong)((uint)uVar71 & 0xf);
    if (uVar70 != 8) {
      uVar73 = *(undefined4 *)(ray + k * 4);
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x10);
      local_11c0 = *(undefined4 *)(ray + k * 4 + 0x20);
      uStack_11bc = local_11c0;
      uStack_11b8 = local_11c0;
      uStack_11b4 = local_11c0;
      uStack_11b0 = local_11c0;
      uStack_11ac = local_11c0;
      uStack_11a8 = local_11c0;
      uStack_11a4 = local_11c0;
      local_11e0 = *(float *)(ray + k * 4 + 0x40);
      fStack_11dc = local_11e0;
      fStack_11d8 = local_11e0;
      fStack_11d4 = local_11e0;
      fStack_11d0 = local_11e0;
      fStack_11cc = local_11e0;
      fStack_11c8 = local_11e0;
      fStack_11c4 = local_11e0;
      local_1200 = *(float *)(ray + k * 4 + 0x50);
      fStack_11fc = local_1200;
      fStack_11f8 = local_1200;
      fStack_11f4 = local_1200;
      fStack_11f0 = local_1200;
      fStack_11ec = local_1200;
      fStack_11e8 = local_1200;
      fStack_11e4 = local_1200;
      uVar71 = uVar71 & 0xfffffffffffffff0;
      local_1220 = *(float *)(ray + k * 4 + 0x60);
      fStack_121c = local_1220;
      fStack_1218 = local_1220;
      fStack_1214 = local_1220;
      fStack_1210 = local_1220;
      fStack_120c = local_1220;
      fStack_1208 = local_1220;
      fStack_1204 = local_1220;
      lVar81 = 0;
      do {
        lVar76 = lVar81 * 0xe0;
        lVar1 = uVar71 + 0xd0 + lVar76;
        local_11a0 = *(undefined8 *)(lVar1 + 0x10);
        uStack_1198 = *(undefined8 *)(lVar1 + 0x18);
        lVar1 = uVar71 + 0xc0 + lVar76;
        local_12a0 = *(undefined8 *)(lVar1 + 0x10);
        uStack_1298 = *(undefined8 *)(lVar1 + 0x18);
        uStack_1290 = local_12a0;
        uStack_1288 = uStack_1298;
        uStack_1190 = local_11a0;
        uStack_1188 = uStack_1198;
        auVar86._16_16_ = *(undefined1 (*) [16])(uVar71 + 0x60 + lVar76);
        auVar86._0_16_ = *(undefined1 (*) [16])(uVar71 + lVar76);
        auVar93._16_16_ = *(undefined1 (*) [16])(uVar71 + 0x70 + lVar76);
        auVar93._0_16_ = *(undefined1 (*) [16])(uVar71 + 0x10 + lVar76);
        auVar84 = *(undefined1 (*) [16])(uVar71 + 0x80 + lVar76);
        auVar115._16_16_ = auVar84;
        auVar115._0_16_ = *(undefined1 (*) [16])(uVar71 + 0x20 + lVar76);
        auVar104 = *(undefined1 (*) [16])(uVar71 + 0x30 + lVar76);
        auVar106._16_16_ = auVar104;
        auVar106._0_16_ = auVar104;
        auVar104 = *(undefined1 (*) [16])(uVar71 + 0x40 + lVar76);
        auVar117._16_16_ = auVar104;
        auVar117._0_16_ = auVar104;
        auVar104 = *(undefined1 (*) [16])(uVar71 + 0x50 + lVar76);
        auVar132._16_16_ = auVar104;
        auVar132._0_16_ = auVar104;
        auVar92 = *(undefined1 (*) [16])(uVar71 + 0x90 + lVar76);
        auVar135._16_16_ = auVar92;
        auVar135._0_16_ = auVar92;
        auVar140 = *(undefined1 (*) [16])(uVar71 + 0xa0 + lVar76);
        auVar136._16_16_ = auVar140;
        auVar136._0_16_ = auVar140;
        auVar90 = *(undefined1 (*) [16])(uVar71 + 0xb0 + lVar76);
        auVar141._16_16_ = auVar90;
        auVar141._0_16_ = auVar90;
        auVar85 = vsubps_avx(auVar86,auVar106);
        auVar105 = vsubps_avx(auVar93,auVar117);
        auVar51 = vsubps_avx(auVar115,auVar132);
        auVar106 = vsubps_avx(auVar135,auVar86);
        auVar117 = vsubps_avx(auVar136,auVar93);
        auVar118 = vsubps_avx(auVar141,auVar115);
        fVar89 = auVar118._0_4_;
        fVar142 = auVar105._0_4_;
        fVar99 = auVar118._4_4_;
        fVar143 = auVar105._4_4_;
        auVar52._4_4_ = fVar143 * fVar99;
        auVar52._0_4_ = fVar142 * fVar89;
        fVar16 = auVar118._8_4_;
        fVar144 = auVar105._8_4_;
        auVar52._8_4_ = fVar144 * fVar16;
        fVar23 = auVar118._12_4_;
        fVar145 = auVar105._12_4_;
        auVar52._12_4_ = fVar145 * fVar23;
        fVar30 = auVar118._16_4_;
        fVar146 = auVar105._16_4_;
        auVar52._16_4_ = fVar146 * fVar30;
        fVar37 = auVar118._20_4_;
        fVar147 = auVar105._20_4_;
        auVar52._20_4_ = fVar147 * fVar37;
        fVar44 = auVar118._24_4_;
        fVar148 = auVar105._24_4_;
        auVar52._24_4_ = fVar148 * fVar44;
        auVar52._28_4_ = auVar104._12_4_;
        fVar94 = auVar117._0_4_;
        fVar149 = auVar51._0_4_;
        fVar156 = auVar117._4_4_;
        fVar150 = auVar51._4_4_;
        auVar53._4_4_ = fVar150 * fVar156;
        auVar53._0_4_ = fVar149 * fVar94;
        fVar17 = auVar117._8_4_;
        fVar151 = auVar51._8_4_;
        auVar53._8_4_ = fVar151 * fVar17;
        fVar24 = auVar117._12_4_;
        fVar152 = auVar51._12_4_;
        auVar53._12_4_ = fVar152 * fVar24;
        fVar31 = auVar117._16_4_;
        fVar153 = auVar51._16_4_;
        auVar53._16_4_ = fVar153 * fVar31;
        fVar38 = auVar117._20_4_;
        fVar154 = auVar51._20_4_;
        auVar53._20_4_ = fVar154 * fVar38;
        fVar45 = auVar117._24_4_;
        fVar155 = auVar51._24_4_;
        auVar53._24_4_ = fVar155 * fVar45;
        auVar53._28_4_ = auVar92._12_4_;
        local_1100 = vsubps_avx(auVar53,auVar52);
        fVar95 = auVar106._0_4_;
        fVar11 = auVar106._4_4_;
        auVar51._4_4_ = fVar150 * fVar11;
        auVar51._0_4_ = fVar149 * fVar95;
        fVar18 = auVar106._8_4_;
        auVar51._8_4_ = fVar151 * fVar18;
        fVar25 = auVar106._12_4_;
        auVar51._12_4_ = fVar152 * fVar25;
        fVar32 = auVar106._16_4_;
        auVar51._16_4_ = fVar153 * fVar32;
        fVar39 = auVar106._20_4_;
        auVar51._20_4_ = fVar154 * fVar39;
        fVar46 = auVar106._24_4_;
        auVar51._24_4_ = fVar155 * fVar46;
        auVar51._28_4_ = auVar92._12_4_;
        fVar123 = auVar85._0_4_;
        fVar125 = auVar85._4_4_;
        auVar54._4_4_ = fVar125 * fVar99;
        auVar54._0_4_ = fVar123 * fVar89;
        fVar126 = auVar85._8_4_;
        auVar54._8_4_ = fVar126 * fVar16;
        fVar127 = auVar85._12_4_;
        auVar54._12_4_ = fVar127 * fVar23;
        fVar128 = auVar85._16_4_;
        auVar54._16_4_ = fVar128 * fVar30;
        fVar129 = auVar85._20_4_;
        auVar54._20_4_ = fVar129 * fVar37;
        fVar130 = auVar85._24_4_;
        auVar54._24_4_ = fVar130 * fVar44;
        auVar54._28_4_ = auVar140._12_4_;
        auVar85 = vsubps_avx(auVar54,auVar51);
        auVar55._4_4_ = fVar125 * fVar156;
        auVar55._0_4_ = fVar123 * fVar94;
        auVar55._8_4_ = fVar126 * fVar17;
        auVar55._12_4_ = fVar127 * fVar24;
        auVar55._16_4_ = fVar128 * fVar31;
        auVar55._20_4_ = fVar129 * fVar38;
        auVar55._24_4_ = fVar130 * fVar45;
        auVar55._28_4_ = auVar140._12_4_;
        auVar56._4_4_ = fVar143 * fVar11;
        auVar56._0_4_ = fVar142 * fVar95;
        auVar56._8_4_ = fVar144 * fVar18;
        auVar56._12_4_ = fVar145 * fVar25;
        auVar56._16_4_ = fVar146 * fVar32;
        auVar56._20_4_ = fVar147 * fVar39;
        auVar56._24_4_ = fVar148 * fVar46;
        auVar56._28_4_ = auVar90._12_4_;
        auVar51 = vsubps_avx(auVar56,auVar55);
        auVar68._4_4_ = uVar73;
        auVar68._0_4_ = uVar73;
        auVar68._8_4_ = uVar73;
        auVar68._12_4_ = uVar73;
        auVar68._16_4_ = uVar73;
        auVar68._20_4_ = uVar73;
        auVar68._24_4_ = uVar73;
        auVar68._28_4_ = uVar73;
        auVar105 = vsubps_avx(auVar86,auVar68);
        auVar67._4_4_ = uVar5;
        auVar67._0_4_ = uVar5;
        auVar67._8_4_ = uVar5;
        auVar67._12_4_ = uVar5;
        auVar67._16_4_ = uVar5;
        auVar67._20_4_ = uVar5;
        auVar67._24_4_ = uVar5;
        auVar67._28_4_ = uVar5;
        auVar52 = vsubps_avx(auVar93,auVar67);
        auVar69._4_4_ = uStack_11bc;
        auVar69._0_4_ = local_11c0;
        auVar69._8_4_ = uStack_11b8;
        auVar69._12_4_ = uStack_11b4;
        auVar69._16_4_ = uStack_11b0;
        auVar69._20_4_ = uStack_11ac;
        auVar69._24_4_ = uStack_11a8;
        auVar69._28_4_ = uStack_11a4;
        auVar53 = vsubps_avx(auVar115,auVar69);
        fVar96 = auVar53._0_4_;
        fVar12 = auVar53._4_4_;
        auVar57._4_4_ = fStack_11fc * fVar12;
        auVar57._0_4_ = local_1200 * fVar96;
        fVar19 = auVar53._8_4_;
        auVar57._8_4_ = fStack_11f8 * fVar19;
        fVar26 = auVar53._12_4_;
        auVar57._12_4_ = fStack_11f4 * fVar26;
        fVar33 = auVar53._16_4_;
        auVar57._16_4_ = fStack_11f0 * fVar33;
        fVar40 = auVar53._20_4_;
        auVar57._20_4_ = fStack_11ec * fVar40;
        fVar47 = auVar53._24_4_;
        auVar57._24_4_ = fStack_11e8 * fVar47;
        auVar57._28_4_ = auVar84._12_4_;
        fVar97 = auVar52._0_4_;
        auVar124._0_4_ = local_1220 * fVar97;
        fVar13 = auVar52._4_4_;
        auVar124._4_4_ = fStack_121c * fVar13;
        fVar20 = auVar52._8_4_;
        auVar124._8_4_ = fStack_1218 * fVar20;
        fVar27 = auVar52._12_4_;
        auVar124._12_4_ = fStack_1214 * fVar27;
        fVar34 = auVar52._16_4_;
        auVar124._16_4_ = fStack_1210 * fVar34;
        fVar41 = auVar52._20_4_;
        auVar124._20_4_ = fStack_120c * fVar41;
        fVar48 = auVar52._24_4_;
        auVar124._28_36_ = auVar137._28_36_;
        auVar124._24_4_ = fStack_1208 * fVar48;
        auVar54 = vsubps_avx(auVar124._0_32_,auVar57);
        fVar98 = auVar105._0_4_;
        fVar14 = auVar105._4_4_;
        auVar58._4_4_ = fStack_121c * fVar14;
        auVar58._0_4_ = local_1220 * fVar98;
        fVar21 = auVar105._8_4_;
        auVar58._8_4_ = fStack_1218 * fVar21;
        fVar28 = auVar105._12_4_;
        auVar58._12_4_ = fStack_1214 * fVar28;
        fVar35 = auVar105._16_4_;
        auVar58._16_4_ = fStack_1210 * fVar35;
        fVar42 = auVar105._20_4_;
        auVar58._20_4_ = fStack_120c * fVar42;
        fVar49 = auVar105._24_4_;
        auVar58._24_4_ = fStack_1208 * fVar49;
        auVar58._28_4_ = auVar137._28_4_;
        auVar137._0_4_ = local_11e0 * fVar96;
        auVar137._4_4_ = fStack_11dc * fVar12;
        auVar137._8_4_ = fStack_11d8 * fVar19;
        auVar137._12_4_ = fStack_11d4 * fVar26;
        auVar137._16_4_ = fStack_11d0 * fVar33;
        auVar137._20_4_ = fStack_11cc * fVar40;
        auVar137._28_36_ = auVar138._28_36_;
        auVar137._24_4_ = fStack_11c8 * fVar47;
        auVar55 = vsubps_avx(auVar137._0_32_,auVar58);
        auVar137 = ZEXT3264(auVar55);
        auVar60._4_4_ = fStack_11dc * fVar13;
        auVar60._0_4_ = local_11e0 * fVar97;
        auVar60._8_4_ = fStack_11d8 * fVar20;
        auVar60._12_4_ = fStack_11d4 * fVar27;
        auVar60._16_4_ = fStack_11d0 * fVar34;
        auVar60._20_4_ = fStack_11cc * fVar41;
        fVar59 = auVar138._28_4_;
        auVar60._24_4_ = fStack_11c8 * fVar48;
        auVar60._28_4_ = fVar59;
        auVar61._4_4_ = fStack_11fc * fVar14;
        auVar61._0_4_ = local_1200 * fVar98;
        auVar61._8_4_ = fStack_11f8 * fVar21;
        auVar61._12_4_ = fStack_11f4 * fVar28;
        auVar61._16_4_ = fStack_11f0 * fVar35;
        auVar61._20_4_ = fStack_11ec * fVar42;
        auVar61._24_4_ = fStack_11e8 * fVar49;
        auVar61._28_4_ = auVar105._28_4_;
        auVar56 = vsubps_avx(auVar61,auVar60);
        local_10c0 = auVar51._0_4_;
        fStack_10bc = auVar51._4_4_;
        fStack_10b8 = auVar51._8_4_;
        fStack_10b4 = auVar51._12_4_;
        fStack_10b0 = auVar51._16_4_;
        fStack_10ac = auVar51._20_4_;
        fStack_10a8 = auVar51._24_4_;
        local_13c0 = auVar85._0_4_;
        fStack_13bc = auVar85._4_4_;
        fStack_13b8 = auVar85._8_4_;
        fStack_13b4 = auVar85._12_4_;
        fStack_13b0 = auVar85._16_4_;
        fStack_13ac = auVar85._20_4_;
        fStack_13a8 = auVar85._24_4_;
        uStack_13a4 = auVar85._28_4_;
        fVar10 = local_1100._0_4_;
        fVar15 = local_1100._4_4_;
        fVar22 = local_1100._8_4_;
        fVar29 = local_1100._12_4_;
        fVar36 = local_1100._16_4_;
        fVar43 = local_1100._20_4_;
        fVar50 = local_1100._24_4_;
        auVar138 = ZEXT3264(CONCAT428(fVar59,CONCAT424(fStack_11c8 * fVar50,
                                                       CONCAT420(fStack_11cc * fVar43,
                                                                 CONCAT416(fStack_11d0 * fVar36,
                                                                           CONCAT412(fStack_11d4 *
                                                                                     fVar29,CONCAT48
                                                  (fStack_11d8 * fVar22,
                                                   CONCAT44(fStack_11dc * fVar15,local_11e0 * fVar10
                                                           ))))))));
        auVar133._0_4_ = local_11e0 * fVar10 + local_13c0 * local_1200 + local_10c0 * local_1220;
        auVar133._4_4_ =
             fStack_11dc * fVar15 + fStack_13bc * fStack_11fc + fStack_10bc * fStack_121c;
        auVar133._8_4_ =
             fStack_11d8 * fVar22 + fStack_13b8 * fStack_11f8 + fStack_10b8 * fStack_1218;
        auVar133._12_4_ =
             fStack_11d4 * fVar29 + fStack_13b4 * fStack_11f4 + fStack_10b4 * fStack_1214;
        auVar133._16_4_ =
             fStack_11d0 * fVar36 + fStack_13b0 * fStack_11f0 + fStack_10b0 * fStack_1210;
        auVar133._20_4_ =
             fStack_11cc * fVar43 + fStack_13ac * fStack_11ec + fStack_10ac * fStack_120c;
        auVar133._24_4_ =
             fStack_11c8 * fVar50 + fStack_13a8 * fStack_11e8 + fStack_10a8 * fStack_1208;
        auVar133._28_4_ = fVar59 + fStack_11e4 + fVar59;
        auVar107._8_4_ = 0x80000000;
        auVar107._0_8_ = 0x8000000080000000;
        auVar107._12_4_ = 0x80000000;
        auVar107._16_4_ = 0x80000000;
        auVar107._20_4_ = 0x80000000;
        auVar107._24_4_ = 0x80000000;
        auVar107._28_4_ = 0x80000000;
        auVar85 = vandps_avx(auVar133,auVar107);
        uVar100 = auVar85._0_4_;
        auVar122._0_4_ =
             (float)(uVar100 ^
                    (uint)(fVar95 * auVar54._0_4_ + fVar89 * auVar56._0_4_ + auVar55._0_4_ * fVar94)
                    );
        uVar74 = auVar85._4_4_;
        auVar122._4_4_ =
             (float)(uVar74 ^ (uint)(fVar11 * auVar54._4_4_ +
                                    fVar99 * auVar56._4_4_ + auVar55._4_4_ * fVar156));
        uVar75 = auVar85._8_4_;
        auVar122._8_4_ =
             (float)(uVar75 ^ (uint)(fVar18 * auVar54._8_4_ +
                                    fVar16 * auVar56._8_4_ + auVar55._8_4_ * fVar17));
        uVar109 = auVar85._12_4_;
        auVar122._12_4_ =
             (float)(uVar109 ^
                    (uint)(fVar25 * auVar54._12_4_ +
                          fVar23 * auVar56._12_4_ + auVar55._12_4_ * fVar24));
        uVar110 = auVar85._16_4_;
        auVar122._16_4_ =
             (float)(uVar110 ^
                    (uint)(fVar32 * auVar54._16_4_ +
                          fVar30 * auVar56._16_4_ + auVar55._16_4_ * fVar31));
        uVar111 = auVar85._20_4_;
        auVar122._20_4_ =
             (float)(uVar111 ^
                    (uint)(fVar39 * auVar54._20_4_ +
                          fVar37 * auVar56._20_4_ + auVar55._20_4_ * fVar38));
        uVar112 = auVar85._24_4_;
        auVar122._24_4_ =
             (float)(uVar112 ^
                    (uint)(fVar46 * auVar54._24_4_ +
                          fVar44 * auVar56._24_4_ + auVar55._24_4_ * fVar45));
        uVar113 = auVar85._28_4_;
        auVar122._28_4_ =
             (float)(uVar113 ^ (uint)(auVar106._28_4_ + auVar118._28_4_ + auVar117._28_4_));
        local_1160._0_4_ =
             (float)(uVar100 ^
                    (uint)(auVar54._0_4_ * fVar123 +
                          fVar149 * auVar56._0_4_ + fVar142 * auVar55._0_4_));
        local_1160._4_4_ =
             (float)(uVar74 ^ (uint)(auVar54._4_4_ * fVar125 +
                                    fVar150 * auVar56._4_4_ + fVar143 * auVar55._4_4_));
        local_1160._8_4_ =
             (float)(uVar75 ^ (uint)(auVar54._8_4_ * fVar126 +
                                    fVar151 * auVar56._8_4_ + fVar144 * auVar55._8_4_));
        local_1160._12_4_ =
             (float)(uVar109 ^
                    (uint)(auVar54._12_4_ * fVar127 +
                          fVar152 * auVar56._12_4_ + fVar145 * auVar55._12_4_));
        local_1160._16_4_ =
             (float)(uVar110 ^
                    (uint)(auVar54._16_4_ * fVar128 +
                          fVar153 * auVar56._16_4_ + fVar146 * auVar55._16_4_));
        local_1160._20_4_ =
             (float)(uVar111 ^
                    (uint)(auVar54._20_4_ * fVar129 +
                          fVar154 * auVar56._20_4_ + fVar147 * auVar55._20_4_));
        local_1160._24_4_ =
             (float)(uVar112 ^
                    (uint)(auVar54._24_4_ * fVar130 +
                          fVar155 * auVar56._24_4_ + fVar148 * auVar55._24_4_));
        local_1160._28_4_ =
             (float)(uVar113 ^ (uint)(auVar54._28_4_ + auVar106._28_4_ + auVar118._28_4_));
        auVar105 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar85 = vcmpps_avx(auVar122,auVar105,5);
        auVar105 = vcmpps_avx(local_1160,auVar105,5);
        auVar85 = vandps_avx(auVar85,auVar105);
        auVar118._8_4_ = 0x7fffffff;
        auVar118._0_8_ = 0x7fffffff7fffffff;
        auVar118._12_4_ = 0x7fffffff;
        auVar118._16_4_ = 0x7fffffff;
        auVar118._20_4_ = 0x7fffffff;
        auVar118._24_4_ = 0x7fffffff;
        auVar118._28_4_ = 0x7fffffff;
        local_1120 = vandps_avx(auVar133,auVar118);
        auVar105 = vcmpps_avx(auVar133,ZEXT1232(ZEXT412(0)) << 0x20,4);
        auVar85 = vandps_avx(auVar85,auVar105);
        auVar119._0_4_ = local_1160._0_4_ + auVar122._0_4_;
        auVar119._4_4_ = local_1160._4_4_ + auVar122._4_4_;
        auVar119._8_4_ = local_1160._8_4_ + auVar122._8_4_;
        auVar119._12_4_ = local_1160._12_4_ + auVar122._12_4_;
        auVar119._16_4_ = local_1160._16_4_ + auVar122._16_4_;
        auVar119._20_4_ = local_1160._20_4_ + auVar122._20_4_;
        auVar119._24_4_ = local_1160._24_4_ + auVar122._24_4_;
        auVar119._28_4_ = local_1160._28_4_ + auVar122._28_4_;
        auVar105 = vcmpps_avx(auVar119,local_1120,2);
        auVar106 = auVar105 & auVar85;
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar106 >> 0x7f,0) != '\0') ||
              (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar106 >> 0xbf,0) != '\0') ||
            (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar106[0x1f] < '\0') {
          auVar85 = vandps_avx(auVar85,auVar105);
          auVar84 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
          local_1140._0_4_ =
               (float)(uVar100 ^ (uint)(fVar10 * fVar98 + local_13c0 * fVar97 + fVar96 * local_10c0)
                      );
          local_1140._4_4_ =
               (float)(uVar74 ^ (uint)(fVar15 * fVar14 + fStack_13bc * fVar13 + fVar12 * fStack_10bc
                                      ));
          local_1140._8_4_ =
               (float)(uVar75 ^ (uint)(fVar22 * fVar21 + fStack_13b8 * fVar20 + fVar19 * fStack_10b8
                                      ));
          local_1140._12_4_ =
               (float)(uVar109 ^
                      (uint)(fVar29 * fVar28 + fStack_13b4 * fVar27 + fVar26 * fStack_10b4));
          local_1140._16_4_ =
               (float)(uVar110 ^
                      (uint)(fVar36 * fVar35 + fStack_13b0 * fVar34 + fVar33 * fStack_10b0));
          local_1140._20_4_ =
               (float)(uVar111 ^
                      (uint)(fVar43 * fVar42 + fStack_13ac * fVar41 + fVar40 * fStack_10ac));
          local_1140._24_4_ =
               (float)(uVar112 ^
                      (uint)(fVar50 * fVar49 + fStack_13a8 * fVar48 + fVar47 * fStack_10a8));
          local_1140._28_4_ = uVar113 ^ (uint)(auVar53._28_4_ + auVar52._28_4_ + auVar53._28_4_);
          fVar89 = *(float *)(ray + k * 4 + 0x30);
          fVar94 = local_1120._0_4_;
          fVar95 = local_1120._4_4_;
          auVar62._4_4_ = fVar95 * fVar89;
          auVar62._0_4_ = fVar94 * fVar89;
          fVar96 = local_1120._8_4_;
          auVar62._8_4_ = fVar96 * fVar89;
          fVar97 = local_1120._12_4_;
          auVar62._12_4_ = fVar97 * fVar89;
          fVar98 = local_1120._16_4_;
          auVar62._16_4_ = fVar98 * fVar89;
          fVar99 = local_1120._20_4_;
          auVar62._20_4_ = fVar99 * fVar89;
          fVar156 = local_1120._24_4_;
          auVar62._24_4_ = fVar156 * fVar89;
          auVar62._28_4_ = fVar89;
          auVar85 = vcmpps_avx(auVar62,local_1140,1);
          fVar89 = *(float *)(ray + k * 4 + 0x80);
          auVar63._4_4_ = fVar95 * fVar89;
          auVar63._0_4_ = fVar94 * fVar89;
          auVar63._8_4_ = fVar96 * fVar89;
          auVar63._12_4_ = fVar97 * fVar89;
          auVar63._16_4_ = fVar98 * fVar89;
          auVar63._20_4_ = fVar99 * fVar89;
          auVar63._24_4_ = fVar156 * fVar89;
          auVar63._28_4_ = fVar89;
          auVar105 = vcmpps_avx(local_1140,auVar63,2);
          auVar85 = vandps_avx(auVar85,auVar105);
          auVar104 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
          auVar84 = vpand_avx(auVar104,auVar84);
          auVar137 = ZEXT1664(auVar84);
          auVar104 = vpmovzxwd_avx(auVar84);
          auVar140 = vpslld_avx(auVar104,0x1f);
          auVar92 = vpsrad_avx(auVar140,0x1f);
          auVar104 = vpunpckhwd_avx(auVar84,auVar84);
          auVar104 = vpslld_avx(auVar104,0x1f);
          auVar104 = vpsrad_avx(auVar104,0x1f);
          local_10a0._16_16_ = auVar104;
          local_10a0._0_16_ = auVar92;
          if ((((((((local_10a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_10a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_10a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_10a0 >> 0x7f,0) != '\0') ||
                (local_10a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar104 >> 0x3f,0) != '\0') ||
              (local_10a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar104[0xf] < '\0') {
            local_1180 = auVar122;
            local_10e0 = local_13c0;
            fStack_10dc = fStack_13bc;
            fStack_10d8 = fStack_13b8;
            fStack_10d4 = fStack_13b4;
            fStack_10d0 = fStack_13b0;
            fStack_10cc = fStack_13ac;
            fStack_10c8 = fStack_13a8;
            uStack_10c4 = uStack_13a4;
            uStack_1384 = auVar51._28_4_;
            uStack_10a4 = uStack_1384;
            local_fc0 = local_1240;
            auVar105 = vrcpps_avx(local_1120);
            local_1280 = local_10a0;
            fVar89 = auVar105._0_4_;
            auVar108._0_4_ = fVar94 * fVar89;
            fVar94 = auVar105._4_4_;
            auVar108._4_4_ = fVar95 * fVar94;
            fVar95 = auVar105._8_4_;
            auVar108._8_4_ = fVar96 * fVar95;
            fVar96 = auVar105._12_4_;
            auVar108._12_4_ = fVar97 * fVar96;
            fVar97 = auVar105._16_4_;
            auVar108._16_4_ = fVar98 * fVar97;
            fVar98 = auVar105._20_4_;
            auVar108._20_4_ = fVar99 * fVar98;
            fVar99 = auVar105._24_4_;
            auVar108._24_4_ = fVar156 * fVar99;
            auVar108._28_4_ = 0;
            auVar116._8_4_ = 0x3f800000;
            auVar116._0_8_ = &DAT_3f8000003f800000;
            auVar116._12_4_ = 0x3f800000;
            auVar116._16_4_ = 0x3f800000;
            auVar116._20_4_ = 0x3f800000;
            auVar116._24_4_ = 0x3f800000;
            auVar116._28_4_ = 0x3f800000;
            auVar51 = vsubps_avx(auVar116,auVar108);
            fVar89 = fVar89 + fVar89 * auVar51._0_4_;
            fVar94 = fVar94 + fVar94 * auVar51._4_4_;
            fVar95 = fVar95 + fVar95 * auVar51._8_4_;
            fVar96 = fVar96 + fVar96 * auVar51._12_4_;
            fVar97 = fVar97 + fVar97 * auVar51._16_4_;
            fVar98 = fVar98 + fVar98 * auVar51._20_4_;
            fVar99 = fVar99 + fVar99 * auVar51._24_4_;
            auVar64._4_4_ = fVar94 * local_1140._4_4_;
            auVar64._0_4_ = fVar89 * local_1140._0_4_;
            auVar64._8_4_ = fVar95 * local_1140._8_4_;
            auVar64._12_4_ = fVar96 * local_1140._12_4_;
            auVar64._16_4_ = fVar97 * local_1140._16_4_;
            auVar64._20_4_ = fVar98 * local_1140._20_4_;
            auVar64._24_4_ = fVar99 * local_1140._24_4_;
            auVar64._28_4_ = auVar56._28_4_;
            local_1040 = auVar64;
            auVar65._4_4_ = fVar94 * auVar122._4_4_;
            auVar65._0_4_ = fVar89 * auVar122._0_4_;
            auVar65._8_4_ = fVar95 * auVar122._8_4_;
            auVar65._12_4_ = fVar96 * auVar122._12_4_;
            auVar65._16_4_ = fVar97 * auVar122._16_4_;
            auVar65._20_4_ = fVar98 * auVar122._20_4_;
            auVar65._24_4_ = fVar99 * auVar122._24_4_;
            auVar65._28_4_ = local_1140._28_4_;
            auVar85 = vminps_avx(auVar65,auVar116);
            auVar66._4_4_ = local_1160._4_4_ * fVar94;
            auVar66._0_4_ = local_1160._0_4_ * fVar89;
            auVar66._8_4_ = local_1160._8_4_ * fVar95;
            auVar66._12_4_ = local_1160._12_4_ * fVar96;
            auVar66._16_4_ = local_1160._16_4_ * fVar97;
            auVar66._20_4_ = local_1160._20_4_ * fVar98;
            auVar66._24_4_ = local_1160._24_4_ * fVar99;
            auVar66._28_4_ = auVar105._28_4_ + auVar51._28_4_;
            auVar105 = vminps_avx(auVar66,auVar116);
            auVar51 = vsubps_avx(auVar116,auVar85);
            auVar106 = vsubps_avx(auVar116,auVar105);
            local_1060 = vblendvps_avx(auVar105,auVar51,local_1240);
            local_1080 = vblendvps_avx(auVar85,auVar106,local_1240);
            local_1020[0] = fVar10 * (float)local_1260._0_4_;
            local_1020[1] = fVar15 * (float)local_1260._4_4_;
            local_1020[2] = fVar22 * fStack_1258;
            local_1020[3] = fVar29 * fStack_1254;
            fStack_1010 = fVar36 * fStack_1250;
            fStack_100c = fVar43 * fStack_124c;
            fStack_1008 = fVar50 * fStack_1248;
            uStack_1004 = local_1080._28_4_;
            local_1000[0] = local_13c0 * (float)local_1260._0_4_;
            local_1000[1] = fStack_13bc * (float)local_1260._4_4_;
            local_1000[2] = fStack_13b8 * fStack_1258;
            local_1000[3] = fStack_13b4 * fStack_1254;
            fStack_ff0 = fStack_13b0 * fStack_1250;
            fStack_fec = fStack_13ac * fStack_124c;
            fStack_fe8 = fStack_13a8 * fStack_1248;
            uStack_fe4 = local_1060._28_4_;
            local_fe0[0] = (float)local_1260._0_4_ * local_10c0;
            local_fe0[1] = (float)local_1260._4_4_ * fStack_10bc;
            local_fe0[2] = fStack_1258 * fStack_10b8;
            local_fe0[3] = fStack_1254 * fStack_10b4;
            fStack_fd0 = fStack_1250 * fStack_10b0;
            fStack_fcc = fStack_124c * fStack_10ac;
            fStack_fc8 = fStack_1248 * fStack_10a8;
            uStack_fc4 = uStack_1244;
            auVar104 = vpunpckhwd_avx(auVar84,auVar84);
            auVar104 = vpslld_avx(auVar104,0x1f);
            auVar87._16_16_ = auVar104;
            auVar87._0_16_ = auVar140;
            auVar120._8_4_ = 0x7f800000;
            auVar120._0_8_ = 0x7f8000007f800000;
            auVar120._12_4_ = 0x7f800000;
            auVar120._16_4_ = 0x7f800000;
            auVar120._20_4_ = 0x7f800000;
            auVar120._24_4_ = 0x7f800000;
            auVar120._28_4_ = 0x7f800000;
            auVar85 = vblendvps_avx(auVar120,auVar64,auVar87);
            auVar105 = vshufps_avx(auVar85,auVar85,0xb1);
            auVar105 = vminps_avx(auVar85,auVar105);
            auVar51 = vshufpd_avx(auVar105,auVar105,5);
            auVar105 = vminps_avx(auVar105,auVar51);
            auVar51 = vperm2f128_avx(auVar105,auVar105,1);
            auVar105 = vminps_avx(auVar105,auVar51);
            auVar85 = vcmpps_avx(auVar85,auVar105,0);
            auVar104 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
            auVar84 = vpand_avx(auVar84,auVar104);
            auVar104 = vpmovzxwd_avx(auVar84);
            auVar104 = vpslld_avx(auVar104,0x1f);
            auVar104 = vpsrad_avx(auVar104,0x1f);
            auVar84 = vpunpckhwd_avx(auVar84,auVar84);
            auVar84 = vpslld_avx(auVar84,0x1f);
            auVar84 = vpsrad_avx(auVar84,0x1f);
            auVar88._16_16_ = auVar84;
            auVar88._0_16_ = auVar104;
            if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar88 >> 0x7f,0) == '\0') &&
                  (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB161(auVar84 >> 0x3f,0) == '\0') &&
                (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar84[0xf]) {
              auVar88 = local_10a0;
            }
            uVar74 = vmovmskps_avx(auVar88);
            uVar100 = 0;
            if (uVar74 != 0) {
              for (; (uVar74 >> uVar100 & 1) == 0; uVar100 = uVar100 + 1) {
              }
            }
            pRVar9 = (context->scene->geometries).items;
            uVar74 = *(uint *)(ray + k * 4 + 0x90);
            local_13e0 = (ulong)uVar100;
            uVar100 = *(uint *)((long)&local_12a0 + local_13e0 * 4);
            while (((pRVar9[uVar100].ptr)->mask & uVar74) == 0) {
              *(undefined4 *)(local_1280 + local_13e0 * 4) = 0;
              if ((((((((local_1280 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_1280 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_1280 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_1280 >> 0x7f,0) == '\0') &&
                    (local_1280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_1280 >> 0xbf,0) == '\0') &&
                  (local_1280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_1280[0x1f]) goto LAB_0035a8f1;
              auVar85 = vblendvps_avx(auVar120,auVar64,local_1280);
              auVar105 = vshufps_avx(auVar85,auVar85,0xb1);
              auVar105 = vminps_avx(auVar85,auVar105);
              auVar51 = vshufpd_avx(auVar105,auVar105,5);
              auVar105 = vminps_avx(auVar105,auVar51);
              auVar51 = vperm2f128_avx(auVar105,auVar105,1);
              auVar105 = vminps_avx(auVar105,auVar51);
              auVar105 = vcmpps_avx(auVar85,auVar105,0);
              auVar51 = local_1280 & auVar105;
              auVar85 = local_1280;
              if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar51 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar51 >> 0x7f,0) != '\0') ||
                    (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar51 >> 0xbf,0) != '\0') ||
                  (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar51[0x1f] < '\0') {
                auVar85 = vandps_avx(auVar105,local_1280);
              }
              uVar75 = vmovmskps_avx(auVar85);
              uVar100 = 0;
              if (uVar75 != 0) {
                for (; (uVar75 >> uVar100 & 1) == 0; uVar100 = uVar100 + 1) {
                }
              }
              local_13e0 = (ulong)uVar100;
              uVar100 = *(uint *)((long)&local_12a0 + local_13e0 * 4);
            }
            uVar6 = *(undefined4 *)(local_1080 + local_13e0 * 4);
            uVar7 = *(undefined4 *)(local_1060 + local_13e0 * 4);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1040 + local_13e0 * 4);
            *(float *)(ray + k * 4 + 0xc0) = local_1020[local_13e0];
            *(float *)(ray + k * 4 + 0xd0) = local_1000[local_13e0];
            *(float *)(ray + k * 4 + 0xe0) = local_fe0[local_13e0];
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar6;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
            *(undefined4 *)(ray + k * 4 + 0x110) =
                 *(undefined4 *)((long)&local_11a0 + local_13e0 * 4);
            *(uint *)(ray + k * 4 + 0x120) = uVar100;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
        }
LAB_0035a8f1:
        lVar81 = lVar81 + 1;
      } while (lVar81 != uVar70 - 8);
    }
    uVar73 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar124 = ZEXT1664(CONCAT412(uVar73,CONCAT48(uVar73,CONCAT44(uVar73,uVar73))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }